

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fixedarena.cpp
# Opt level: O0

int test1(void)

{
  undefined1 *this;
  bool bVar1;
  void *pvVar2;
  ostream *poVar3;
  void *ptr;
  MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> memCtx;
  undefined1 local_fa30 [7];
  NoActionMemLogger logger;
  FixedArena arena;
  char buffer [64000];
  int local_c;
  
  cookmem::FixedArena::FixedArena((FixedArena *)local_fa30,&arena.m_used,64000);
  this = &memCtx.m_pool.field_0x247;
  cookmem::NoActionMemLogger::NoActionMemLogger((NoActionMemLogger *)this);
  cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::MemContext
            ((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)&ptr,
             (FixedArena *)local_fa30,(NoActionMemLogger *)this,false);
  pvVar2 = cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::allocate
                     ((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)&ptr,0x1e
                     );
  if (pvVar2 == (void *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x22);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_c = 1;
  }
  else {
    cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::deallocate
              ((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)&ptr,pvVar2,0);
    pvVar2 = cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::allocate
                       ((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)&ptr,
                        300);
    bVar1 = cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::contains
                      ((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)&ptr,
                       pvVar2,false);
    if (bVar1) {
      bVar1 = cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::contains
                        ((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)&ptr,
                         pvVar2,true);
      if (bVar1) {
        if (pvVar2 == (void *)0x0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x28);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          local_c = 1;
        }
        else {
          pvVar2 = cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::
                   allocate((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)
                            &ptr,3000);
          if (pvVar2 == (void *)0x0) {
            poVar3 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2a);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            local_c = 1;
          }
          else {
            pvVar2 = cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::
                     allocate((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)
                              &ptr,30000);
            if (pvVar2 == (void *)0x0) {
              poVar3 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2c);
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              local_c = 1;
            }
            else {
              pvVar2 = cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::
                       allocate((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *
                                )&ptr,30000);
              if (pvVar2 == (void *)0x0) {
                poVar3 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2e);
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                local_c = 1;
              }
              else {
                pvVar2 = cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>
                         ::allocate((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>
                                     *)&ptr,30000);
                if (pvVar2 == (void *)0x0) {
                  bVar1 = cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>
                          ::contains((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>
                                      *)&ptr,local_fa30,false);
                  if (bVar1) {
                    poVar3 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x32);
                    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                    local_c = 1;
                  }
                  else {
                    local_c = 0;
                  }
                }
                else {
                  poVar3 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x30);
                  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                  local_c = 1;
                }
              }
            }
          }
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x27);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        local_c = 1;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x26);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_c = 1;
    }
  }
  cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::~MemContext
            ((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)&ptr);
  return local_c;
}

Assistant:

static int
test1 ()
{
    char buffer[64000];
    cookmem::FixedArena arena (buffer, sizeof(buffer));
	cookmem::NoActionMemLogger logger;
	cookmem::MemContext< cookmem::FixedArena, cookmem::NoActionMemLogger> memCtx (arena, logger);

    void* ptr;

    ptr = memCtx.allocate (30);
    ASSERT_NE (nullptr, ptr);
    memCtx.deallocate (ptr);

    ptr = memCtx.allocate (300);
    ASSERT_EQ (true, memCtx.contains (ptr));
    ASSERT_EQ (true, memCtx.contains (ptr, true));
    ASSERT_NE (nullptr, ptr);
    ptr = memCtx.allocate (3000);
    ASSERT_NE (nullptr, ptr);
    ptr = memCtx.allocate (30000);
    ASSERT_NE (nullptr, ptr);
    ptr = memCtx.allocate (30000);
    ASSERT_NE (nullptr, ptr);
    ptr = memCtx.allocate (30000);
    ASSERT_EQ (nullptr, ptr);

    ASSERT_EQ (false, memCtx.contains ((void*)&arena));

    return 0;
}